

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_memory_object.h
# Opt level: O0

void __thiscall
SharedMemoryObject<pthread_mutex_t>::SharedMemoryObject<>(SharedMemoryObject<pthread_mutex_t> *this)

{
  pthread_mutex_t *ppVar1;
  ContextManager *pCVar2;
  string local_30;
  SharedMemoryObject<pthread_mutex_t> *local_10;
  SharedMemoryObject<pthread_mutex_t> *this_local;
  
  local_10 = this;
  ppVar1 = (pthread_mutex_t *)allocate_shared_memory(0x28);
  this->ptr_ = ppVar1;
  ppVar1 = this->ptr_;
  memset(ppVar1,0,0x28);
  this->ptr_ = ppVar1;
  if (this->ptr_ == (pthread_mutex_t *)0xffffffffffffffff) {
    pCVar2 = ContextManager::get();
    format_abi_cxx11_(&local_30,"Cannot allocate %zu bytes of shared memory: %m",0x28);
    (**pCVar2->_vptr_ContextManager)(pCVar2,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
  }
  return;
}

Assistant:

explicit SharedMemoryObject(Args &&... args) {
        ptr_ = static_cast<T *>(allocate_shared_memory(sizeof(T)));
        ptr_ = new(ptr_) T(args...);
        if (ptr_ == MAP_FAILED) {
            die(format("Cannot allocate %zu bytes of shared memory: %m", sizeof(T)));
        }
    }